

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Visitor_tmpl_impl.hpp
# Opt level: O0

AVisitor<hiberlite::LoadBean> * __thiscall
hiberlite::AVisitor<hiberlite::LoadBean>::operator&
          (AVisitor<hiberlite::LoadBean> *this,sql_nvp<hiberlite::bean_ptr<B>_> *nvp)

{
  string local_38 [32];
  sql_nvp<hiberlite::bean_ptr<B>_> *local_18;
  sql_nvp<hiberlite::bean_ptr<B>_> *nvp_local;
  AVisitor<hiberlite::LoadBean> *this_local;
  
  local_18 = nvp;
  nvp_local = (sql_nvp<hiberlite::bean_ptr<B>_> *)this;
  std::__cxx11::string::string(local_38,(string *)nvp);
  divePrefix(this,(string *)local_38);
  std::__cxx11::string::~string(local_38);
  walk<hiberlite::bean_ptr<B>>(this,nvp->value);
  pop(this);
  return this;
}

Assistant:

AVisitor<C>& AVisitor<C>::operator&(sql_nvp<X> nvp)
{
	divePrefix(nvp.name);
		walk(nvp.value);
	pop();
	return *this;
}